

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O1

void __thiscall
nuraft::asio_rpc_listener::handle_accept
          (asio_rpc_listener *this,ptr<asio_rpc_listener> *self,ptr<rpc_session> *session,
          error_code *err)

{
  uint uVar1;
  element_type *peVar2;
  int iVar3;
  lock_guard<std::mutex> guard;
  undefined1 local_68 [32];
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (err->_M_value == 0) {
    if (peVar2 != (element_type *)0x0) {
      iVar3 = (**(code **)(*(long *)peVar2 + 0x38))();
      if (3 < iVar3) {
        peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_((string *)local_68,"receive a incoming rpc connection");
        (**(code **)(*(long *)peVar2 + 0x40))
                  (peVar2,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/asio_service.cxx"
                   ,"handle_accept",0x344,local_68);
        if ((mutex_type *)local_68._0_8_ != (mutex_type *)(local_68 + 0x10)) {
          operator_delete((void *)local_68._0_8_);
        }
      }
    }
    rpc_session::prepare_handshake
              ((session->super___shared_ptr<nuraft::rpc_session,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
              );
  }
  else if (peVar2 != (element_type *)0x0) {
    iVar3 = (**(code **)(*(long *)peVar2 + 0x38))();
    if (1 < iVar3) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      uVar1 = err->_M_value;
      (**(code **)(*(long *)err->_M_cat + 0x20))(local_48,err->_M_cat,uVar1);
      msg_if_given_abi_cxx11_
                ((string *)local_68,"failed to accept a rpc connection due to error %d, %s",
                 (ulong)uVar1,local_48[0]);
      (**(code **)(*(long *)peVar2 + 0x40))
                (peVar2,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/asio_service.cxx"
                 ,"handle_accept",0x349,local_68);
      if ((mutex_type *)local_68._0_8_ != (mutex_type *)(local_68 + 0x10)) {
        operator_delete((void *)local_68._0_8_);
      }
      if (local_48[0] != local_38) {
        operator_delete(local_48[0]);
      }
    }
  }
  local_68._0_8_ = &this->listener_lock_;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)local_68._0_8_);
  if (iVar3 == 0) {
    if (this->stopped_ == false) {
      start(this,(lock_guard<std::mutex> *)local_68);
    }
    pthread_mutex_unlock((pthread_mutex_t *)local_68._0_8_);
    return;
  }
  std::__throw_system_error(iVar3);
}

Assistant:

void handle_accept(ptr<asio_rpc_listener> self,
                       ptr<rpc_session> session,
                       const ERROR_CODE& err)
    {
        if (!err) {
            p_in("receive a incoming rpc connection");
            session->prepare_handshake();

        } else {
            p_er( "failed to accept a rpc connection due to error %d, %s",
                  err.value(), err.message().c_str() );
        }

        std::lock_guard<std::mutex> guard(listener_lock_);
        if (!stopped_) {
            // Re-listen only when not stopped,
            // otherwise crash happens as this class or `acceptor_`
            // may be destroyed in the meantime.
            this->start(guard);
        }
    }